

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpc_t2cod.c
# Opt level: O3

void jpc_pi_destroy(jpc_pi_t *pi)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  jpc_picomp_t *ptr;
  uint **ppuVar4;
  jpc_pirlvl_t *ptr_00;
  
  ptr = pi->picomps;
  if (ptr != (jpc_picomp_t *)0x0) {
    uVar1 = pi->numcomps;
    if (uVar1 != 0) {
      uVar2 = 0;
      do {
        ptr_00 = ptr->pirlvls;
        if (ptr_00 != (jpc_pirlvl_t *)0x0) {
          uVar1 = ptr->numrlvls;
          if (uVar1 != 0) {
            ppuVar4 = &ptr_00->prclyrnos;
            uVar3 = 0;
            do {
              if (*ppuVar4 != (uint *)0x0) {
                jas_free(*ppuVar4);
                uVar1 = ptr->numrlvls;
              }
              uVar3 = uVar3 + 1;
              ppuVar4 = ppuVar4 + 4;
            } while (uVar3 < uVar1);
            ptr_00 = ptr->pirlvls;
          }
          jas_free(ptr_00);
          uVar1 = pi->numcomps;
        }
        uVar2 = uVar2 + 1;
        ptr = ptr + 1;
      } while (uVar2 < uVar1);
      ptr = pi->picomps;
    }
    jas_free(ptr);
  }
  if (pi->pchglist != (jpc_pchglist_t *)0x0) {
    jpc_pchglist_destroy(pi->pchglist);
  }
  jas_free(pi);
  return;
}

Assistant:

void jpc_pi_destroy(jpc_pi_t *pi)
{
	jpc_picomp_t *picomp;
	unsigned compno;
	if (pi->picomps) {
		for (compno = 0, picomp = pi->picomps; compno < pi->numcomps;
		  ++compno, ++picomp) {
			jpc_picomp_destroy(picomp);
		}
		jas_free(pi->picomps);
	}
	if (pi->pchglist) {
		jpc_pchglist_destroy(pi->pchglist);
	}
	jas_free(pi);
}